

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O2

Storyboard * __thiscall
ApprovalTests::Storyboard::addDescriptionWithData(Storyboard *this,string *description,string *data)

{
  ostream *poVar1;
  
  poVar1 = ::std::operator<<((ostream *)&this->field_0x10,(string *)description);
  poVar1 = ::std::operator<<(poVar1,": ");
  poVar1 = ::std::operator<<(poVar1,(string *)data);
  ::std::operator<<(poVar1,"\n");
  this->addNewLineBeforeNextFrame_ = true;
  return this;
}

Assistant:

Storyboard& Storyboard::addDescriptionWithData(const std::string& description,
                                                   const std::string& data)
    {
        output_ << description << ": " << data << "\n";
        addNewLineBeforeNextFrame_ = true;
        return *this;
    }